

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O3

int __thiscall google::protobuf::MessageLite::ByteSize(MessageLite *this)

{
  int iVar1;
  undefined4 extraout_var;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  iVar1 = (*this->_vptr_MessageLite[0xc])();
  if ((CONCAT44(extraout_var,iVar1) & 0xffffffff80000000) != 0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_util.h"
               ,0xd4);
    other = internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: (size) <= (static_cast<size_t>(2147483647)): ");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return iVar1;
}

Assistant:

int ByteSize() const { return internal::ToIntSize(ByteSizeLong()); }